

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meanfield_cpu.cpp
# Opt level: O2

void __thiscall
MeanField::CPU::CRF::CRF
          (CRF *this,int width,int height,int dimensions,float spatialSD,float bilateralSpatialSD,
          float bilateralIntensitySD,bool separable)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  
  (this->super_CRF)._vptr_CRF = (_func_int **)&PTR_filterGaussian_001089c0;
  this->width = width;
  this->height = height;
  this->dimensions = dimensions;
  this->spatialSD = spatialSD;
  this->bilateralSpatialSD = bilateralSpatialSD;
  this->bilateralIntensitySD = bilateralIntensitySD;
  this->spatialWeight = 1.0;
  this->bilateralWeight = 1.0;
  this->separable = separable;
  uVar5 = height * width * dimensions;
  uVar4 = 0xffffffffffffffff;
  if (-1 < (int)uVar5) {
    uVar4 = (ulong)uVar5 * 4;
  }
  pfVar1 = (float *)operator_new__(uVar4);
  memset(pfVar1,0,uVar4);
  (this->QDistribution)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar1;
  pfVar1 = (float *)operator_new__(uVar4);
  memset(pfVar1,0,uVar4);
  (this->QDistributionTmp)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar1;
  uVar7 = (ulong)(uint)(dimensions * dimensions) << 2;
  pfVar1 = (float *)operator_new__(uVar7);
  memset(pfVar1,0,uVar7);
  (this->pottsModel)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar1;
  pfVar2 = (float *)operator_new__(uVar4);
  memset(pfVar2,0,uVar4);
  (this->gaussianOut)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar2;
  pfVar2 = (float *)operator_new__(uVar4);
  memset(pfVar2,0,uVar4);
  (this->bilateralOut)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar2;
  pfVar2 = (float *)operator_new__(uVar4);
  memset(pfVar2,0,uVar4);
  (this->aggregatedFilters)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar2;
  pfVar2 = (float *)operator_new__(uVar4);
  memset(pfVar2,0,uVar4);
  (this->filterOutTmp)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar2;
  pfVar2 = (float *)operator_new__(0x400);
  memset(pfVar2,0,0x400);
  (this->spatialKernel)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar2;
  pfVar3 = (float *)operator_new__(0x400);
  uVar7 = 0;
  memset(pfVar3,0,0x400);
  (this->bilateralSpatialKernel)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
  _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar3;
  pfVar3 = (float *)operator_new__(0x400);
  memset(pfVar3,0,0x400);
  (this->bilateralIntensityKernel)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
  _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar3;
  uVar4 = 0;
  if (0 < dimensions) {
    uVar4 = (ulong)(uint)dimensions;
  }
  for (; uVar7 != uVar4; uVar7 = uVar7 + 1) {
    for (uVar6 = 0; (uint)dimensions != uVar6; uVar6 = uVar6 + 1) {
      fVar8 = -1.0;
      if (uVar7 != uVar6) {
        fVar8 = 0.0;
      }
      pfVar1[uVar6] = fVar8;
    }
    pfVar1 = pfVar1 + dimensions;
  }
  Filtering::generateGaussianKernel(pfVar2,0x100,spatialSD);
  Filtering::generateGaussianKernel
            ((this->bilateralSpatialKernel)._M_t.
             super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
             super__Head_base<0UL,_float_*,_false>._M_head_impl,0x100,bilateralSpatialSD);
  Filtering::generateGaussianKernel
            ((this->bilateralIntensityKernel)._M_t.
             super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
             super__Head_base<0UL,_float_*,_false>._M_head_impl,0x100,bilateralIntensitySD);
  return;
}

Assistant:

CRF::CRF(int width, int height, int dimensions, float spatialSD,
    float bilateralSpatialSD, float bilateralIntensitySD, bool separable) :
    width(width), height(height), dimensions(dimensions),
    spatialWeight(1.0), bilateralWeight(1.0),
    spatialSD(spatialSD), bilateralSpatialSD(bilateralSpatialSD),
    bilateralIntensitySD(bilateralIntensitySD),
    separable(separable),
    QDistribution(new float[width*height*dimensions]()),
    QDistributionTmp(new float[width*height*dimensions]()),
    pottsModel(new float[dimensions*dimensions]()),
    gaussianOut(new float[width*height*dimensions]()),
    bilateralOut(new float[width*height*dimensions]()),
    aggregatedFilters(new float[width*height*dimensions]()),
    filterOutTmp(new float[width*height*dimensions]()),
    spatialKernel(new float[KERNEL_SIZE]()),
    bilateralSpatialKernel(new float[KERNEL_SIZE]()),
    bilateralIntensityKernel(new float[KERNEL_SIZE]()) {

    //Initialise potts model.
    for (int i = 0; i < dimensions; i++) {
        for (int j = 0; j < dimensions; j++) {
            pottsModel[i*dimensions + j] = (i == j) ? -1.0 : 0.0;
        }
    }

    //Initialise kernels.
    generateGaussianKernel(spatialKernel.get(), KERNEL_SIZE, spatialSD);
    generateGaussianKernel(bilateralSpatialKernel.get(), KERNEL_SIZE, bilateralSpatialSD);
    generateGaussianKernel(bilateralIntensityKernel.get(), KERNEL_SIZE, bilateralIntensitySD);
}